

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.cpp
# Opt level: O1

void Diligent::ValidateRenderPassDesc
               (RenderPassDesc *Desc,RenderDeviceInfo *DeviceInfo,GraphicsAdapterInfo *AdapterInfo)

{
  byte bVar1;
  Uint32 *pUVar2;
  uint uVar3;
  char *pcVar4;
  AttachmentReference *pAVar5;
  ShadingRateAttachment *pSVar6;
  SubpassDesc *pSVar7;
  SubpassDependencyDesc *pSVar8;
  RESOURCE_STATE RVar9;
  uint uVar10;
  ulong uVar11;
  TextureFormatAttribs *pTVar12;
  TextureFormatAttribs *Args_12;
  ShadingRateAttachment *Args_1;
  RESOURCE_STATE extraout_EDX;
  RESOURCE_STATE RVar13;
  RENDER_DEVICE_TYPE State;
  RESOURCE_STATE extraout_EDX_00;
  RESOURCE_STATE extraout_EDX_01;
  RENDER_DEVICE_TYPE RVar14;
  RESOURCE_STATE RVar15;
  RESOURCE_STATE extraout_EDX_02;
  Uint32 *extraout_RDX;
  Uint32 *extraout_RDX_00;
  Uint32 *extraout_RDX_01;
  Uint32 *extraout_RDX_02;
  Uint32 *extraout_RDX_03;
  Uint32 *extraout_RDX_04;
  Uint32 *pUVar16;
  Uint32 *extraout_RDX_05;
  Uint32 *extraout_RDX_06;
  Uint32 *extraout_RDX_07;
  Uint32 *extraout_RDX_08;
  Uint32 *extraout_RDX_09;
  Uint32 *extraout_RDX_10;
  Uint32 *extraout_RDX_11;
  Uint32 *extraout_RDX_12;
  Uint32 *extraout_RDX_13;
  Uint32 *pUVar17;
  Uint32 *extraout_RDX_14;
  Uint32 *extraout_RDX_15;
  Uint32 *extraout_RDX_16;
  Uint32 *extraout_RDX_17;
  Uint32 *extraout_RDX_18;
  Uint32 *extraout_RDX_19;
  Uint32 *extraout_RDX_20;
  Uint32 *extraout_RDX_21;
  Uint32 *extraout_RDX_22;
  AttachmentReference *AttchRef;
  RenderPassAttachmentDesc *pRVar18;
  AttachmentReference *Args_4;
  bool bVar19;
  uint local_d4;
  char *local_d0;
  string msg;
  Uint32 PrsvAttachment;
  uint uStack_a4;
  RENDER_DEVICE_TYPE local_a0;
  uint local_9c;
  Uint32 *local_98;
  ShadingRateAttachment *local_90;
  Uint32 *local_88;
  Uint32 *local_80;
  GraphicsAdapterInfo *local_78;
  Uint32 *local_70;
  Uint32 *local_68;
  Uint32 *local_60;
  Uint32 *local_58;
  char *local_50;
  RenderDeviceInfo *local_48;
  char *local_40;
  char *local_38;
  
  local_a0 = DeviceInfo->Type;
  pUVar16 = &Desc->AttachmentCount;
  local_78 = AdapterInfo;
  local_48 = DeviceInfo;
  if ((Desc->AttachmentCount != 0) && (Desc->pAttachments == (RenderPassAttachmentDesc *)0x0)) {
    pcVar4 = (Desc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar4 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar4;
    }
    LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[41]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x33,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [23])0x91b6ea,pUVar16,
               (char (*) [41])") is not zero, but pAttachments is null.");
  }
  if (Desc->SubpassCount == 0) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[44]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x3a,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",
               (char (*) [44])"render pass must have at least one subpass.");
  }
  if (Desc->pSubpasses == (SubpassDesc *)0x0) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[29]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x40,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [29])"pSubpasses must not be null.");
  }
  local_88 = &Desc->DependencyCount;
  if ((Desc->DependencyCount != 0) && (Desc->pDependencies == (SubpassDependencyDesc *)0x0)) {
    msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
    if (msg._M_dataplus._M_p == (char *)0x0) {
      msg._M_dataplus._M_p = "";
    }
    LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[42]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x48,(char (*) [29])"Description of render pass \'",(char **)&msg,
               (char (*) [15])"\' is invalid: ",(char (*) [23])"the dependency count (",local_88,
               (char (*) [42])") is not zero, but pDependencies is null.");
  }
  _PrsvAttachment = (char *)((ulong)uStack_a4 << 0x20);
  local_98 = pUVar16;
  if (*pUVar16 != 0) {
    uVar11 = 0;
    do {
      pRVar18 = Desc->pAttachments;
      if (pRVar18[uVar11].Format == TEX_FORMAT_UNKNOWN) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[26],unsigned_int,char[13]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x4f,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [26])"the format of attachment ",
                   &PrsvAttachment,(char (*) [13])" is unknown.");
      }
      pRVar18 = pRVar18 + uVar11;
      if (pRVar18->SampleCount == '\0') {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[10]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x52,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [32])"the sample count of attachment "
                   ,&PrsvAttachment,(char (*) [10])0x91d7b1);
      }
      bVar1 = pRVar18->SampleCount - 1;
      if ((pRVar18->SampleCount ^ bVar1) <= bVar1) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        local_d0 = (char *)CONCAT44(local_d0._4_4_,(uint)pRVar18->SampleCount);
        LogError<true,char[29],char_const*,char[15],char[19],unsigned_int,char[17],unsigned_int,char[22]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x55,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [19])0x91b631,(uint *)&local_d0,
                   (char (*) [17])") of attachment ",&PrsvAttachment,
                   (char (*) [22])" is not power of two.");
      }
      pTVar12 = GetTextureFormatAttribs(pRVar18->Format);
      RVar15 = pRVar18->InitialState;
      if ((byte)(pTVar12->ComponentType - COMPONENT_TYPE_DEPTH) < 2) {
        if ((int)RVar15 < 0x800) {
          RVar9 = extraout_EDX;
          if (RVar15 - RESOURCE_STATE_UNDEFINED < 0x40) {
            RVar13 = 0x80000001;
            RVar9 = 0x80000001;
            if ((0x8000000080000001U >> ((ulong)(RVar15 - RESOURCE_STATE_UNDEFINED) & 0x3f) & 1) !=
                0) goto LAB_006f36a5;
          }
          RVar13 = RVar9;
          if ((RVar15 != RESOURCE_STATE_DEPTH_READ) && (RVar15 != RESOURCE_STATE_SHADER_RESOURCE))
          goto LAB_006f3612;
        }
        else {
          RVar13 = extraout_EDX;
          if ((int)RVar15 < 0x2000) {
            if ((RVar15 != RESOURCE_STATE_COPY_DEST) && (RVar15 != RESOURCE_STATE_COPY_SOURCE))
            goto LAB_006f3612;
          }
          else if ((RVar15 != RESOURCE_STATE_RESOLVE_DEST) &&
                  ((RVar15 != RESOURCE_STATE_RESOLVE_SOURCE &&
                   (RVar15 != RESOURCE_STATE_INPUT_ATTACHMENT)))) {
LAB_006f3612:
            if ((local_a0 != RENDER_DEVICE_TYPE_VULKAN) || (RVar15 != RESOURCE_STATE_COMMON)) {
              local_d0 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d0 == (char *)0x0) {
                local_d0 = "";
              }
              GetResourceStateString_abi_cxx11_
                        (&msg,(Diligent *)(ulong)pRVar18->InitialState,RVar13);
              LogError<true,char[29],char_const*,char[15],char[47],unsigned_int,char[3],std::__cxx11::string,char[14]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x67,(char (*) [29])"Description of render pass \'",&local_d0,
                         (char (*) [15])"\' is invalid: ",
                         (char (*) [47])"the initial state of depth-stencil attachment ",
                         &PrsvAttachment,(char (*) [3])0x82e2c2,&msg,(char (*) [14])") is invalid.")
              ;
              RVar13 = extraout_EDX_00;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                RVar13 = extraout_EDX_01;
              }
            }
          }
        }
LAB_006f36a5:
        RVar15 = pRVar18->FinalState;
        if ((int)RVar15 < 0x800) {
          if ((int)RVar15 < 0x80) {
            if ((RVar15 != RESOURCE_STATE_UNORDERED_ACCESS) &&
               (RVar15 != RESOURCE_STATE_DEPTH_WRITE)) goto LAB_006f3721;
          }
          else if ((RVar15 != RESOURCE_STATE_DEPTH_READ) &&
                  (RVar15 != RESOURCE_STATE_SHADER_RESOURCE)) goto LAB_006f3721;
        }
        else if ((int)RVar15 < 0x2000) {
          if ((RVar15 != RESOURCE_STATE_COPY_DEST) && (RVar15 != RESOURCE_STATE_COPY_SOURCE))
          goto LAB_006f3721;
        }
        else if ((RVar15 != RESOURCE_STATE_RESOLVE_DEST) &&
                ((RVar15 != RESOURCE_STATE_RESOLVE_SOURCE &&
                 (RVar15 != RESOURCE_STATE_INPUT_ATTACHMENT)))) {
LAB_006f3721:
          if ((local_a0 != RENDER_DEVICE_TYPE_VULKAN) || (RVar15 != RESOURCE_STATE_COMMON)) {
            local_d0 = (Desc->super_DeviceObjectAttribs).Name;
            if (local_d0 == (char *)0x0) {
              local_d0 = "";
            }
            GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)pRVar18->FinalState,RVar13);
            LogError<true,char[29],char_const*,char[15],char[45],unsigned_int,char[3],std::__cxx11::string,char[14]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x75,(char (*) [29])"Description of render pass \'",&local_d0,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [45])"the final state of depth-stencil attachment ",&PrsvAttachment
                       ,(char (*) [3])0x82e2c2,&msg,(char (*) [14])") is invalid.");
LAB_006f3798:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      else {
        RVar13 = extraout_EDX;
        if ((int)RVar15 < 0x1000) {
          if ((((RESOURCE_STATE_UNORDERED_ACCESS < RVar15) ||
               (RVar13 = RESOURCE_STATE_PRESENT|RESOURCE_STATE_VERTEX_BUFFER,
               (0x100010002U >> ((ulong)RVar15 & 0x3f) & 1) == 0)) &&
              (RVar15 != RESOURCE_STATE_SHADER_RESOURCE)) && (RVar15 != RESOURCE_STATE_COPY_DEST))
          goto LAB_006f345a;
        }
        else if ((int)RVar15 < 0x8000) {
          if (((RVar15 != RESOURCE_STATE_COPY_SOURCE) && (RVar15 != RESOURCE_STATE_RESOLVE_DEST)) &&
             (RVar15 != RESOURCE_STATE_RESOLVE_SOURCE)) {
LAB_006f345a:
            if ((local_a0 != RENDER_DEVICE_TYPE_VULKAN) || (RVar15 != RESOURCE_STATE_COMMON)) {
              local_d0 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d0 == (char *)0x0) {
                local_d0 = "";
              }
              GetResourceStateString_abi_cxx11_
                        (&msg,(Diligent *)(ulong)pRVar18->InitialState,RVar13);
              LogError<true,char[29],char_const*,char[15],char[39],unsigned_int,char[3],std::__cxx11::string,char[14]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x87,(char (*) [29])"Description of render pass \'",&local_d0,
                         (char (*) [15])"\' is invalid: ",
                         (char (*) [39])"the initial state of color attachment ",&PrsvAttachment,
                         (char (*) [3])0x82e2c2,&msg,(char (*) [14])") is invalid.");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
          }
        }
        else if (((RVar15 != RESOURCE_STATE_INPUT_ATTACHMENT) && (RVar15 != RESOURCE_STATE_PRESENT))
                && (RVar15 != RESOURCE_STATE_MAX_BIT)) goto LAB_006f345a;
        RVar14 = pRVar18->FinalState;
        if ((int)RVar14 < 0x1000) {
          if ((int)RVar14 < 0x100) {
            if ((RVar14 != 0x10) && (RVar14 != 0x20)) goto LAB_006f356b;
          }
          else if ((RVar14 != 0x100) && (RVar14 != 0x800)) goto LAB_006f356b;
        }
        else if ((int)RVar14 < 0x4000) {
          if ((RVar14 != 0x1000) && (RVar14 != 0x2000)) goto LAB_006f356b;
        }
        else if ((RVar14 != 0x4000) && ((RVar14 != 0x8000 && (RVar14 != 0x10000)))) {
LAB_006f356b:
          State = RVar14 ^ 0x100000 | local_a0 ^ RENDER_DEVICE_TYPE_VULKAN;
          if ((RVar14 != 0x200000) && (State != RENDER_DEVICE_TYPE_UNDEFINED)) {
            local_d0 = (Desc->super_DeviceObjectAttribs).Name;
            if (local_d0 == (char *)0x0) {
              local_d0 = "";
            }
            GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)pRVar18->FinalState,State);
            LogError<true,char[29],char_const*,char[15],char[37],unsigned_int,char[3],std::__cxx11::string,char[14]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x96,(char (*) [29])"Description of render pass \'",&local_d0,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [37])"the final state of color attachment ",&PrsvAttachment,
                       (char (*) [3])0x82e2c2,&msg,(char (*) [14])") is invalid.");
            goto LAB_006f3798;
          }
        }
      }
      uVar10 = PrsvAttachment + 1;
      uVar11 = (ulong)uVar10;
      _PrsvAttachment = (char *)CONCAT44(uStack_a4,uVar10);
    } while (uVar10 < *local_98);
  }
  local_d4 = 0;
  if (Desc->SubpassCount == 0) {
    local_90 = (ShadingRateAttachment *)0x0;
  }
  else {
    bVar19 = local_a0 == RENDER_DEVICE_TYPE_VULKAN;
    local_38 = "INPUT_ATTACHMENT";
    if (bVar19) {
      local_38 = "INPUT_ATTACHMENT or COMMON";
    }
    local_40 = "RENDER_TARGET";
    if (bVar19) {
      local_40 = "RENDER_TARGET or COMMON";
    }
    local_50 = "DEPTH_READ or DEPTH_WRITE";
    if (bVar19) {
      local_50 = "DEPTH_READ, DEPTH_WRITE or COMMON";
    }
    local_58 = (local_78->ShadingRate).MinTileSize;
    local_68 = (local_78->ShadingRate).MaxTileSize;
    pUVar16 = (local_78->ShadingRate).MinTileSize + 1;
    local_70 = (local_78->ShadingRate).MaxTileSize + 1;
    local_90 = (ShadingRateAttachment *)0x0;
    local_60 = pUVar16;
    do {
      pSVar7 = Desc->pSubpasses + local_d4;
      if ((pSVar7->InputAttachmentCount != 0) &&
         (pSVar7->pInputAttachments == (AttachmentReference *)0x0)) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[29],unsigned_int,char[14],unsigned_int,char[47]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0xa2,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [29])"the input attachment count (",
                   &pSVar7->InputAttachmentCount,(char (*) [14])") of subpass ",&local_d4,
                   (char (*) [47])" is not zero, while pInputAttachments is null.");
        pUVar16 = extraout_RDX;
      }
      pUVar2 = &pSVar7->RenderTargetAttachmentCount;
      if ((pSVar7->RenderTargetAttachmentCount != 0) &&
         (pSVar7->pRenderTargetAttachments == (AttachmentReference *)0x0)) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[37],unsigned_int,char[14],unsigned_int,char[54]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0xa7,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [37])"the render target attachment count (",pUVar2,
                   (char (*) [14])") of subpass ",&local_d4,
                   (char (*) [54])" is not zero, while pRenderTargetAttachments is null.");
        pUVar16 = extraout_RDX_00;
      }
      local_80 = &pSVar7->PreserveAttachmentCount;
      if ((pSVar7->PreserveAttachmentCount != 0) && (pSVar7->pPreserveAttachments == (Uint32 *)0x0))
      {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[14],unsigned_int,char[50]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0xac,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [32])"the preserve attachment count ("
                   ,local_80,(char (*) [14])") of subpass ",&local_d4,
                   (char (*) [50])" is not zero, while pPreserveAttachments is null.");
        pUVar16 = extraout_RDX_01;
      }
      local_9c = 0;
      if (pSVar7->InputAttachmentCount != 0) {
        uVar11 = 0;
        do {
          uVar10 = pSVar7->pInputAttachments[uVar11].AttachmentIndex;
          pUVar16 = (Uint32 *)(ulong)uVar10;
          if (uVar10 != 0xffffffff) {
            pAVar5 = pSVar7->pInputAttachments + uVar11;
            if (*local_98 <= uVar10) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[33],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xbc,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                         &pAVar5->AttachmentIndex,(char (*) [33])") of input attachment reference ",
                         &local_9c,(char (*) [13])0x91fa95,&local_d4,
                         (char (*) [47])" must be less than the number of attachments (",local_98,
                         (char (*) [3])0x930cd5);
            }
            RVar14 = pAVar5->State ^ 0x100000 | local_a0 ^ RENDER_DEVICE_TYPE_VULKAN;
            pUVar16 = (Uint32 *)(ulong)RVar14;
            if ((pAVar5->State != 0x8000) && (RVar14 != RENDER_DEVICE_TYPE_UNDEFINED)) {
              local_d0 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d0 == (char *)0x0) {
                local_d0 = "";
              }
              _PrsvAttachment = local_38;
              GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)pAVar5->State,RVar14);
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[44],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xc3,(char (*) [29])"Description of render pass \'",&local_d0,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         &pAVar5->AttachmentIndex,
                         (char (*) [44])" referenced as input attachment in subpass ",&local_d4,
                         (char (*) [13])" must be in ",(char **)&PrsvAttachment,
                         (char (*) [32])0x920167,&msg);
              pUVar16 = extraout_RDX_02;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                pUVar16 = extraout_RDX_03;
              }
            }
          }
          local_9c = local_9c + 1;
          uVar11 = (ulong)local_9c;
        } while (local_9c < pSVar7->InputAttachmentCount);
      }
      local_9c = 0;
      if (*pUVar2 != 0) {
        uVar11 = 0;
        do {
          uVar10 = pSVar7->pRenderTargetAttachments[uVar11].AttachmentIndex;
          pUVar16 = (Uint32 *)(ulong)uVar10;
          if (uVar10 != 0xffffffff) {
            pAVar5 = pSVar7->pRenderTargetAttachments + uVar11;
            if (*local_98 <= uVar10) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[41],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xd4,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                         &pAVar5->AttachmentIndex,
                         (char (*) [41])") of render target attachment reference ",&local_9c,
                         (char (*) [13])0x91fa95,&local_d4,
                         (char (*) [47])" must be less than the number of attachments (",local_98,
                         (char (*) [3])0x930cd5);
            }
            RVar14 = pAVar5->State ^ 0x100000 | local_a0 ^ RENDER_DEVICE_TYPE_VULKAN;
            if ((pAVar5->State != 0x10) && (RVar14 != RENDER_DEVICE_TYPE_UNDEFINED)) {
              local_d0 = (Desc->super_DeviceObjectAttribs).Name;
              if (local_d0 == (char *)0x0) {
                local_d0 = "";
              }
              _PrsvAttachment = local_40;
              GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)pAVar5->State,RVar14);
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xdb,(char (*) [29])"Description of render pass \'",&local_d0,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         &pAVar5->AttachmentIndex,
                         (char (*) [52])" referenced as render target attachment in subpass ",
                         &local_d4,(char (*) [13])" must be in ",(char **)&PrsvAttachment,
                         (char (*) [32])0x920167,&msg);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
            pTVar12 = GetTextureFormatAttribs(Desc->pAttachments[pAVar5->AttachmentIndex].Format);
            pUVar16 = extraout_RDX_04;
            if ((pTVar12->ComponentType < 0xb) &&
               (pUVar16 = (Uint32 *)0x580, (0x580U >> (pTVar12->ComponentType & 0x1f) & 1) != 0)) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[14],char_const*,char[45]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0xe5,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                         &pAVar5->AttachmentIndex,
                         (char (*) [52])" referenced as render target attachment in subpass ",
                         &local_d4,(char (*) [14])" uses format ",&pTVar12->Name,
                         (char (*) [45])", which is not a valid render target format.");
              pUVar16 = extraout_RDX_05;
            }
          }
          local_9c = local_9c + 1;
          uVar11 = (ulong)local_9c;
        } while (local_9c < *pUVar2);
      }
      pUVar17 = local_98;
      if ((pSVar7->pResolveAttachments != (AttachmentReference *)0x0) &&
         (local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000), *pUVar2 != 0)) {
        uVar10 = 0;
        do {
          uVar3 = pSVar7->pResolveAttachments[uVar10].AttachmentIndex;
          pUVar16 = (Uint32 *)(ulong)uVar3;
          if ((uVar3 != 0xffffffff) && (*pUVar17 <= uVar3)) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[35],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0xf8,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                       &pSVar7->pResolveAttachments[uVar10].AttachmentIndex,
                       (char (*) [35])") of resolve attachment reference ",(uint *)&local_d0,
                       (char (*) [13])0x91fa95,&local_d4,
                       (char (*) [47])" must be less than the number of attachments (",pUVar17,
                       (char (*) [3])0x930cd5);
            pUVar16 = extraout_RDX_06;
          }
          uVar10 = (int)local_d0 + 1;
          local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar10);
        } while (uVar10 < *pUVar2);
      }
      RVar15 = (RESOURCE_STATE)pUVar16;
      pAVar5 = pSVar7->pDepthStencilAttachment;
      if ((pAVar5 != (AttachmentReference *)0x0) && (pAVar5->AttachmentIndex != 0xffffffff)) {
        if (*local_98 <= pAVar5->AttachmentIndex) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[47],unsigned_int,char[3]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x109,(char (*) [29])"Description of render pass \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                     &pAVar5->AttachmentIndex,
                     (char (*) [52])") of depth-stencil attachment reference of subpass ",&local_d4,
                     (char (*) [47])" must be less than the number of attachments (",local_98,
                     (char (*) [3])0x930cd5);
          RVar15 = extraout_EDX_02;
        }
        RVar13 = pAVar5->State;
        if (((RVar13 != RESOURCE_STATE_DEPTH_WRITE) && (RVar13 != RESOURCE_STATE_DEPTH_READ)) &&
           ((local_a0 != RENDER_DEVICE_TYPE_VULKAN || (RVar13 != RESOURCE_STATE_COMMON)))) {
          local_d0 = (Desc->super_DeviceObjectAttribs).Name;
          if (local_d0 == (char *)0x0) {
            local_d0 = "";
          }
          _PrsvAttachment = local_50;
          GetResourceStateString_abi_cxx11_(&msg,(Diligent *)(ulong)pAVar5->State,RVar15);
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x110,(char (*) [29])"Description of render pass \'",&local_d0,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                     &pAVar5->AttachmentIndex,
                     (char (*) [52])" referenced as depth stencil attachment in subpass ",&local_d4,
                     (char (*) [13])" must be in ",(char **)&PrsvAttachment,(char (*) [32])0x920167,
                     &msg);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        pTVar12 = GetTextureFormatAttribs(Desc->pAttachments[pAVar5->AttachmentIndex].Format);
        pUVar16 = extraout_RDX_07;
        if (1 < (byte)(pTVar12->ComponentType - COMPONENT_TYPE_DEPTH)) {
          msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
          if (msg._M_dataplus._M_p == (char *)0x0) {
            msg._M_dataplus._M_p = "";
          }
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[14],char_const*,char[44]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x119,(char (*) [29])"Description of render pass \'",(char **)&msg,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                     &pAVar5->AttachmentIndex,
                     (char (*) [52])" referenced as depth-stencil attachment in subpass ",&local_d4,
                     (char (*) [14])" uses format ",&pTVar12->Name,
                     (char (*) [44])", which is not a valid depth buffer format.");
          pUVar16 = extraout_RDX_08;
        }
      }
      pUVar17 = local_98;
      local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000);
      if (*local_80 != 0) {
        uVar11 = 0;
        do {
          _PrsvAttachment = (char *)CONCAT44(uStack_a4,pSVar7->pPreserveAttachments[uVar11]);
          if (pSVar7->pPreserveAttachments[uVar11] == 0xffffffff) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[55],unsigned_int,char[13],unsigned_int,char[23]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x126,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [55])"the attachment index of preserve attachment reference ",
                       (uint *)&local_d0,(char (*) [13])0x91fa95,&local_d4,(char (*) [23])0x91ff45);
            pUVar16 = extraout_RDX_09;
          }
          if (*pUVar17 <= PrsvAttachment) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[36],unsigned_int,char[13],unsigned_int,char[37],unsigned_int,char[3]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,300,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                       &PrsvAttachment,(char (*) [36])") of preserve attachment reference ",
                       (uint *)&local_d0,(char (*) [13])0x91fa95,&local_d4,
                       (char (*) [37])" exceeds the number of attachments (",pUVar17,
                       (char (*) [3])0x930cd5);
            pUVar16 = extraout_RDX_10;
          }
          uVar10 = (int)local_d0 + 1;
          uVar11 = (ulong)uVar10;
          local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar10);
        } while (uVar10 < *local_80);
      }
      if ((pSVar7->pResolveAttachments != (AttachmentReference *)0x0) &&
         (local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000), *pUVar2 != 0)) {
        uVar10 = 0;
        do {
          pAVar5 = pSVar7->pResolveAttachments;
          Args_4 = pSVar7->pRenderTargetAttachments + uVar10;
          if ((pAVar5[uVar10].AttachmentIndex != 0xffffffff) &&
             (Args_4->AttachmentIndex == 0xffffffff)) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[47],unsigned_int,char[102]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x13c,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [32])"pResolveAttachments of subpass ",&local_d4,
                       (char (*) [47])" is not null and resolve attachment reference ",
                       (uint *)&local_d0,
                       (char (*) [102])
                       " is not ATTACHMENT_UNUSED, but corresponding render target attachment reference is ATTACHMENT_UNUSED."
                      );
            pUVar16 = extraout_RDX_11;
          }
          pAVar5 = pAVar5 + uVar10;
          if ((pAVar5->AttachmentIndex != 0xffffffff) &&
             (Desc->pAttachments[Args_4->AttachmentIndex].SampleCount == '\x01')) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[35],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[72]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x146,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [35])"Render target attachment at index ",&Args_4->AttachmentIndex,
                       (char (*) [15])" referenced by",(char (*) [23])0x91fedf,(uint *)&local_d0,
                       (char (*) [13])0x91fa95,&local_d4,
                       (char (*) [72])
                       " is used as the source of resolve operation, but its sample count is 1.");
            pUVar16 = extraout_RDX_12;
          }
          if (((ulong)pAVar5->AttachmentIndex != 0xffffffff) &&
             (Desc->pAttachments[pAVar5->AttachmentIndex].SampleCount != '\x01')) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[29],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[30]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x150,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",
                       (char (*) [29])"Resolve attachment at index ",&pAVar5->AttachmentIndex,
                       (char (*) [15])" referenced by",(char (*) [23])0x91fedf,(uint *)&local_d0,
                       (char (*) [13])0x91fa95,&local_d4,
                       (char (*) [30])" must have sample count of 1.");
            pUVar16 = extraout_RDX_13;
          }
          if (((ulong)Args_4->AttachmentIndex != 0xffffffff) &&
             (pUVar17 = (Uint32 *)(ulong)pAVar5->AttachmentIndex, pUVar16 = pUVar17,
             pUVar17 != (Uint32 *)0xffffffff)) {
            pRVar18 = Desc->pAttachments;
            pUVar16 = (Uint32 *)((long)pUVar17 * 0x10);
            if (pRVar18[Args_4->AttachmentIndex].Format != pRVar18[(long)pUVar17].Format) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              pTVar12 = GetTextureFormatAttribs(pRVar18[Args_4->AttachmentIndex].Format);
              Args_12 = GetTextureFormatAttribs(Desc->pAttachments[pAVar5->AttachmentIndex].Format);
              LogError<true,char[29],char_const*,char[15],char[13],char_const*,char[40],unsigned_int,char[37],unsigned_int,char[13],unsigned_int,char[29],char_const*,char[52],unsigned_int,char[2]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x160,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [13])"The format (",
                         &pTVar12->Name,(char (*) [40])") of render target attachment at index ",
                         &Args_4->AttachmentIndex,
                         (char (*) [37])" referenced by attachment reference ",(uint *)&local_d0,
                         (char (*) [13])0x91fa95,&local_d4,
                         (char (*) [29])" does not match the format (",&Args_12->Name,
                         (char (*) [52])") of the corresponding resolve attachment at index ",
                         &pAVar5->AttachmentIndex,(char (*) [2])0x91f766);
              pUVar16 = extraout_RDX_14;
            }
          }
          uVar10 = (int)local_d0 + 1;
          local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar10);
        } while (uVar10 < *pUVar2);
      }
      pSVar6 = pSVar7->pShadingRateAttachment;
      if (pSVar6 != (ShadingRateAttachment *)0x0) {
        if (local_90 == (ShadingRateAttachment *)0x0) {
          local_90 = pSVar6;
        }
        uVar10 = (pSVar6->Attachment).AttachmentIndex;
        if (uVar10 != 0xffffffff) {
          if (*local_98 <= uVar10) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[51],unsigned_int,char[47],unsigned_int,char[3]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x16e,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                       (uint *)pSVar6,
                       (char (*) [51])") of shading rate attachment reference of subpass ",&local_d4
                       ,(char (*) [47])" must be less than the number of attachments (",local_98,
                       (char (*) [3])0x930cd5);
            pUVar16 = extraout_RDX_15;
          }
          if ((local_48->Features).VariableRateShading == DEVICE_FEATURE_STATE_DISABLED) {
            msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
            if (msg._M_dataplus._M_p == (char *)0x0) {
              msg._M_dataplus._M_p = "";
            }
            LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[87]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x172,(char (*) [29])"Description of render pass \'",(char **)&msg,
                       (char (*) [15])"\' is invalid: ",(char (*) [9])0x91fa99,&local_d4,
                       (char (*) [87])
                       " uses a shading rate attachment, but VariableRateShading device feature is not enabled"
                      );
            pUVar16 = extraout_RDX_16;
          }
          if ((pSVar6->Attachment).State != RESOURCE_STATE_MAX_BIT) {
            local_d0 = (Desc->super_DeviceObjectAttribs).Name;
            if (local_d0 == (char *)0x0) {
              local_d0 = "";
            }
            GetResourceStateString_abi_cxx11_
                      (&msg,(Diligent *)(ulong)(pSVar6->Attachment).State,(RESOURCE_STATE)pUVar16);
            LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[51],unsigned_int,char[56],std::__cxx11::string>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x177,(char (*) [29])"Description of render pass \'",&local_d0,
                       (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                       (uint *)pSVar6,
                       (char (*) [51])" referenced as shading rate attachment in subpass ",&local_d4
                       ,(char (*) [56])" must be in SHADING_RATE state, but specified state is ",
                       &msg);
            pUVar16 = extraout_RDX_17;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              pUVar16 = extraout_RDX_18;
            }
          }
          pSVar6 = pSVar7->pShadingRateAttachment;
          uVar10 = pSVar6->TileSize[0];
          if ((uVar10 != 0) || (pSVar6->TileSize[1] != 0)) {
            pUVar2 = pSVar6->TileSize;
            if ((uVar10 < *local_58) || (*local_68 < uVar10)) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char[36],unsigned_int,char[3],unsigned_int,char[67]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x181,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [9])0x91fa99,&local_d4,
                         (char (*) [47])" uses shading rate attachment with tile width ",pUVar2,
                         (char (*) [36])" that is not in the allowed range [",local_58,
                         (char (*) [3])0x92ff04,local_68,
                         (char (*) [67])
                         "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
              pUVar16 = extraout_RDX_19;
            }
            pUVar17 = pSVar6->TileSize + 1;
            if ((pSVar6->TileSize[1] < *local_60) || (*local_70 < pSVar6->TileSize[1])) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[48],unsigned_int,char[36],unsigned_int,char[3],unsigned_int,char[67]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x187,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [9])0x91fa99,&local_d4,
                         (char (*) [48])" uses shading rate attachment with tile height ",pUVar17,
                         (char (*) [36])" that is not in the allowed range [",local_60,
                         (char (*) [3])0x92ff04,local_70,
                         (char (*) [67])
                         "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
              pUVar16 = extraout_RDX_20;
            }
            if (*pUVar2 != *pUVar17) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char[39],unsigned_int,char[2]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x18d,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [9])0x91fa99,&local_d4,
                         (char (*) [47])" uses shading rate attachment with tile width ",pUVar2,
                         (char (*) [39])" that is not equal to the tile height ",pUVar17,
                         (char (*) [2])0x91f766);
              pUVar16 = extraout_RDX_21;
            }
            uVar10 = *pUVar2 - 1;
            if (((*pUVar2 ^ uVar10) <= uVar10) ||
               (uVar10 = *pUVar17 - 1, (*pUVar17 ^ uVar10) <= uVar10)) {
              msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
              if (msg._M_dataplus._M_p == (char *)0x0) {
                msg._M_dataplus._M_p = "";
              }
              local_d0 = (char *)CONCAT71(local_d0._1_7_,0x78);
              LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char,unsigned_int,char[31]>
                        (false,"ValidateRenderPassDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                         ,0x192,(char (*) [29])"Description of render pass \'",(char **)&msg,
                         (char (*) [15])"\' is invalid: ",(char (*) [9])0x91fa99,&local_d4,
                         (char (*) [47])" uses shading rate attachment with tile sizes ",pUVar2,
                         (char *)&local_d0,pUVar17,(char (*) [31])" that are not a powers of two.");
              pUVar16 = extraout_RDX_22;
            }
          }
        }
      }
      local_d4 = local_d4 + 1;
    } while (local_d4 < Desc->SubpassCount);
  }
  if (((local_90 != (ShadingRateAttachment *)0x0) &&
      (((local_78->ShadingRate).CapFlags & SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS)
       != SHADING_RATE_CAP_FLAG_NONE)) &&
     (local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000), Desc->SubpassCount != 0)) {
    uVar10 = 0;
    do {
      pSVar7 = Desc->pSubpasses;
      if (pSVar7[uVar10].pShadingRateAttachment == (ShadingRateAttachment *)0x0) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[57],unsigned_int,char[198]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x1a3,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [57])"render pass uses a shading rate attachment, but subpass ",
                   (uint *)&local_d0,
                   (char (*) [198])
                   " uses no shading rate attachment. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability requires that all subpasses of a render pass use the same shading rate attachment."
                  );
      }
      pSVar6 = pSVar7[uVar10].pShadingRateAttachment;
      uVar10 = (pSVar6->Attachment).AttachmentIndex;
      Args_1 = (ShadingRateAttachment *)(ulong)uVar10;
      if (((uVar10 != (local_90->Attachment).AttachmentIndex) ||
          (RVar15 = (local_90->Attachment).State, Args_1 = (ShadingRateAttachment *)(ulong)RVar15,
          (pSVar6->Attachment).State != RVar15)) ||
         ((Args_1 = (ShadingRateAttachment *)(ulong)pSVar6->TileSize[0],
          pSVar6->TileSize[0] != local_90->TileSize[0] ||
          (Args_1 = local_90, pSVar6->TileSize[1] != local_90->TileSize[1])))) {
        if ((int)local_d0 == 0) {
          FormatString<char[26],char[12]>
                    (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"subpass > 0",
                     (char (*) [12])Args_1);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[36],unsigned_int,char[236]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x1ac,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",(char (*) [36])0x92012b,(uint *)&local_d0,
                   (char (*) [236])
                   " does not match the shading rate attachment used by previous subpasses. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability requires that all subpasses of a render pass use the same shading rate attachment."
                  );
      }
      uVar10 = (int)local_d0 + 1;
      local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar10);
    } while (uVar10 < Desc->SubpassCount);
  }
  local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000);
  if (*local_88 != 0) {
    uVar10 = 0;
    do {
      pSVar8 = Desc->pDependencies;
      if (pSVar8[uVar10].SrcStageMask == PIPELINE_STAGE_FLAG_UNDEFINED) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[45],unsigned_int,char[15]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x1b7,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [45])"the source stage mask of subpass dependency ",(uint *)&local_d0,
                   (char (*) [15])0x920ccc);
      }
      if (pSVar8[uVar10].DstStageMask == PIPELINE_STAGE_FLAG_UNDEFINED) {
        msg._M_dataplus._M_p = (Desc->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        LogError<true,char[29],char_const*,char[15],char[50],unsigned_int,char[15]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x1bb,(char (*) [29])"Description of render pass \'",(char **)&msg,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [50])"the destination stage mask of subpass dependency ",
                   (uint *)&local_d0,(char (*) [15])0x920ccc);
      }
      uVar10 = (int)local_d0 + 1;
      local_d0 = (char *)CONCAT44(local_d0._4_4_,uVar10);
    } while (uVar10 < *local_88);
  }
  return;
}

Assistant:

void ValidateRenderPassDesc(const RenderPassDesc&      Desc,
                            const RenderDeviceInfo&    DeviceInfo,
                            const GraphicsAdapterInfo& AdapterInfo) noexcept(false)
{
#define LOG_RENDER_PASS_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of render pass '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    const DeviceFeatures&        Features = DeviceInfo.Features;
    const ShadingRateProperties& SRProps  = AdapterInfo.ShadingRate;
    const bool                   IsVulkan = DeviceInfo.IsVulkanDevice();

    if (Desc.AttachmentCount != 0 && Desc.pAttachments == nullptr)
    {
        // If attachmentCount is not 0, pAttachments must be a valid pointer to an
        // array of attachmentCount valid VkAttachmentDescription structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pAttachments-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("the attachment count (", Desc.AttachmentCount, ") is not zero, but pAttachments is null.");
    }

    if (Desc.SubpassCount == 0)
    {
        // subpassCount must be greater than 0.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-subpassCount-arraylength
        LOG_RENDER_PASS_ERROR_AND_THROW("render pass must have at least one subpass.");
    }
    if (Desc.pSubpasses == nullptr)
    {
        // pSubpasses must be a valid pointer to an array of subpassCount valid VkSubpassDescription structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pSubpasses-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("pSubpasses must not be null.");
    }

    if (Desc.DependencyCount != 0 && Desc.pDependencies == nullptr)
    {
        // If dependencyCount is not 0, pDependencies must be a valid pointer to an array of
        // dependencyCount valid VkSubpassDependency structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pDependencies-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("the dependency count (", Desc.DependencyCount, ") is not zero, but pDependencies is null.");
    }

    for (Uint32 i = 0; i < Desc.AttachmentCount; ++i)
    {
        const RenderPassAttachmentDesc& Attachment = Desc.pAttachments[i];
        if (Attachment.Format == TEX_FORMAT_UNKNOWN)
            LOG_RENDER_PASS_ERROR_AND_THROW("the format of attachment ", i, " is unknown.");

        if (Attachment.SampleCount == 0)
            LOG_RENDER_PASS_ERROR_AND_THROW("the sample count of attachment ", i, " is zero.");

        if (!IsPowerOfTwo(Attachment.SampleCount))
            LOG_RENDER_PASS_ERROR_AND_THROW("the sample count (", Uint32{Attachment.SampleCount}, ") of attachment ", i, " is not power of two.");

        const TextureFormatAttribs& FmtInfo = GetTextureFormatAttribs(Attachment.Format);
        if (FmtInfo.ComponentType == COMPONENT_TYPE_DEPTH ||
            FmtInfo.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            if (Attachment.InitialState != RESOURCE_STATE_DEPTH_WRITE &&
                Attachment.InitialState != RESOURCE_STATE_DEPTH_READ &&
                Attachment.InitialState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.InitialState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_DEST &&
                Attachment.InitialState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.InitialState != RESOURCE_STATE_UNDEFINED &&
                !(IsVulkan && Attachment.InitialState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the initial state of depth-stencil attachment ", i, " (", GetResourceStateString(Attachment.InitialState), ") is invalid.");
            }

            if (Attachment.FinalState != RESOURCE_STATE_DEPTH_WRITE &&
                Attachment.FinalState != RESOURCE_STATE_DEPTH_READ &&
                Attachment.FinalState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.FinalState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_DEST &&
                Attachment.FinalState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                !(IsVulkan && Attachment.FinalState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the final state of depth-stencil attachment ", i, " (", GetResourceStateString(Attachment.FinalState), ") is invalid.");
            }
        }
        else
        {
            if (Attachment.InitialState != RESOURCE_STATE_RENDER_TARGET &&
                Attachment.InitialState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.InitialState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_DEST &&
                Attachment.InitialState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.InitialState != RESOURCE_STATE_PRESENT &&
                Attachment.InitialState != RESOURCE_STATE_SHADING_RATE &&
                Attachment.InitialState != RESOURCE_STATE_UNDEFINED &&
                !(IsVulkan && Attachment.InitialState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the initial state of color attachment ", i, " (", GetResourceStateString(Attachment.InitialState), ") is invalid.");
            }

            if (Attachment.FinalState != RESOURCE_STATE_RENDER_TARGET &&
                Attachment.FinalState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.FinalState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_DEST &&
                Attachment.FinalState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.FinalState != RESOURCE_STATE_PRESENT &&
                Attachment.FinalState != RESOURCE_STATE_SHADING_RATE &&
                !(IsVulkan && Attachment.FinalState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the final state of color attachment ", i, " (", GetResourceStateString(Attachment.FinalState), ") is invalid.");
            }
        }
    }

    const ShadingRateAttachment* pShadingRateAttachment = nullptr;
    for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
    {
        const SubpassDesc& Subpass = Desc.pSubpasses[subpass];
        if (Subpass.InputAttachmentCount != 0 && Subpass.pInputAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the input attachment count (", Subpass.InputAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pInputAttachments is null.");
        }
        if (Subpass.RenderTargetAttachmentCount != 0 && Subpass.pRenderTargetAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the render target attachment count (", Subpass.RenderTargetAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pRenderTargetAttachments is null.");
        }
        if (Subpass.PreserveAttachmentCount != 0 && Subpass.pPreserveAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the preserve attachment count (", Subpass.PreserveAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pPreserveAttachments is null.");
        }

        for (Uint32 input_attachment = 0; input_attachment < Subpass.InputAttachmentCount; ++input_attachment)
        {
            const AttachmentReference& AttchRef = Subpass.pInputAttachments[input_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
            // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
            // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
            if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of input attachment reference ", input_attachment,
                                                " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
            }

            if (!(AttchRef.State == RESOURCE_STATE_INPUT_ATTACHMENT || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as input attachment in subpass ", subpass,
                                                " must be in ", (IsVulkan ? "INPUT_ATTACHMENT or COMMON" : "INPUT_ATTACHMENT"), " state, but specified state is ",
                                                GetResourceStateString(AttchRef.State));
            }
        }

        for (Uint32 rt_attachment = 0; rt_attachment < Subpass.RenderTargetAttachmentCount; ++rt_attachment)
        {
            const AttachmentReference& AttchRef = Subpass.pRenderTargetAttachments[rt_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
            // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
            // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
            if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of render target attachment reference ", rt_attachment,
                                                " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
            }

            if (!(AttchRef.State == RESOURCE_STATE_RENDER_TARGET || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as render target attachment in subpass ", subpass,
                                                " must be in ", (IsVulkan ? "RENDER_TARGET or COMMON" : "RENDER_TARGET"), " state, but specified state is ",
                                                GetResourceStateString(AttchRef.State));
            }

            const TEXTURE_FORMAT        Fmt        = Desc.pAttachments[AttchRef.AttachmentIndex].Format;
            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Fmt);
            if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as render target attachment in subpass ", subpass,
                                                " uses format ", FmtAttribs.Name, ", which is not a valid render target format.");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 rslv_attachment = 0; rslv_attachment < Subpass.RenderTargetAttachmentCount; ++rslv_attachment)
            {
                const AttachmentReference& AttchRef = Subpass.pResolveAttachments[rslv_attachment];
                if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                    continue;

                // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
                // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
                // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of resolve attachment reference ", rslv_attachment,
                                                    " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }
            }
        }

        if (Subpass.pDepthStencilAttachment != nullptr)
        {
            const AttachmentReference& AttchRef = *Subpass.pDepthStencilAttachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
                // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
                // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of depth-stencil attachment reference of subpass ", subpass,
                                                    " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }

                if (!(AttchRef.State == RESOURCE_STATE_DEPTH_READ || AttchRef.State == RESOURCE_STATE_DEPTH_WRITE || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as depth stencil attachment in subpass ", subpass,
                                                    " must be in ", (IsVulkan ? "DEPTH_READ, DEPTH_WRITE or COMMON" : "DEPTH_READ or DEPTH_WRITE"),
                                                    " state, but specified state is ", GetResourceStateString(AttchRef.State));
                }

                const TEXTURE_FORMAT        Fmt        = Desc.pAttachments[AttchRef.AttachmentIndex].Format;
                const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Fmt);
                if (FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH &&
                    FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as depth-stencil attachment in subpass ", subpass,
                                                    " uses format ", FmtAttribs.Name, ", which is not a valid depth buffer format.");
                }
            }
        }

        for (Uint32 prsv_attachment = 0; prsv_attachment < Subpass.PreserveAttachmentCount; ++prsv_attachment)
        {
            const Uint32 PrsvAttachment = Subpass.pPreserveAttachments[prsv_attachment];
            if (PrsvAttachment == ATTACHMENT_UNUSED)
            {
                // The attachment member of each element of pPreserveAttachments must not be VK_ATTACHMENT_UNUSED
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-attachment-00853
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index of preserve attachment reference ", prsv_attachment,
                                                " of subpass ", subpass, " is ATTACHMENT_UNUSED.");
            }

            if (PrsvAttachment >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", PrsvAttachment, ") of preserve attachment reference ", prsv_attachment,
                                                " of subpass ", subpass, " exceeds the number of attachments (", Desc.AttachmentCount, ").");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 attchmnt = 0; attchmnt < Subpass.RenderTargetAttachmentCount; ++attchmnt)
            {
                const AttachmentReference& RTAttachmentRef   = Subpass.pRenderTargetAttachments[attchmnt];
                const AttachmentReference& RslvAttachmentRef = Subpass.pResolveAttachments[attchmnt];
                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && RTAttachmentRef.AttachmentIndex == ATTACHMENT_UNUSED)
                {
                    // If pResolveAttachments is not NULL, for each resolve attachment that is not VK_ATTACHMENT_UNUSED,
                    // the corresponding color attachment must not be VK_ATTACHMENT_UNUSED
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00847
                    LOG_RENDER_PASS_ERROR_AND_THROW("pResolveAttachments of subpass ", subpass, " is not null and resolve attachment reference ", attchmnt,
                                                    " is not ATTACHMENT_UNUSED, but corresponding render target attachment reference is ATTACHMENT_UNUSED.");
                }

                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && Desc.pAttachments[RTAttachmentRef.AttachmentIndex].SampleCount == 1)
                {
                    // If pResolveAttachments is not NULL, for each resolve attachment that is not VK_ATTACHMENT_UNUSED,
                    // the corresponding color attachment must not have a sample count of VK_SAMPLE_COUNT_1_BIT
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00848
                    LOG_RENDER_PASS_ERROR_AND_THROW("Render target attachment at index ", RTAttachmentRef.AttachmentIndex, " referenced by",
                                                    " attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " is used as the source of resolve operation, but its sample count is 1.");
                }

                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].SampleCount != 1)
                {
                    // If pResolveAttachments is not NULL, each resolve attachment that is not VK_ATTACHMENT_UNUSED must
                    // have a sample count of VK_SAMPLE_COUNT_1_BIT
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00849
                    LOG_RENDER_PASS_ERROR_AND_THROW("Resolve attachment at index ", RslvAttachmentRef.AttachmentIndex, " referenced by",
                                                    " attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " must have sample count of 1.");
                }

                if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED &&
                    Desc.pAttachments[RTAttachmentRef.AttachmentIndex].Format != Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].Format)
                {
                    // If pResolveAttachments is not NULL, each resolve attachment that is not VK_ATTACHMENT_UNUSED
                    // must have the same VkFormat as its corresponding color attachment.
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00850
                    LOG_RENDER_PASS_ERROR_AND_THROW("The format (",
                                                    GetTextureFormatAttribs(Desc.pAttachments[RTAttachmentRef.AttachmentIndex].Format).Name,
                                                    ") of render target attachment at index ", RTAttachmentRef.AttachmentIndex,
                                                    " referenced by attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " does not match the format (",
                                                    GetTextureFormatAttribs(Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].Format).Name,
                                                    ") of the corresponding resolve attachment at index ",
                                                    RslvAttachmentRef.AttachmentIndex, ".");
                }
            }
        }

        if (Subpass.pShadingRateAttachment != nullptr)
        {
            pShadingRateAttachment              = pShadingRateAttachment != nullptr ? pShadingRateAttachment : Subpass.pShadingRateAttachment;
            const AttachmentReference& AttchRef = Subpass.pShadingRateAttachment->Attachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of shading rate attachment reference of subpass ", subpass,
                                                    " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }

                if (!Features.VariableRateShading)
                    LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses a shading rate attachment, but VariableRateShading device feature is not enabled");

                if (AttchRef.State != RESOURCE_STATE_SHADING_RATE)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as shading rate attachment in subpass ", subpass,
                                                    " must be in SHADING_RATE state, but specified state is ", GetResourceStateString(AttchRef.State));
                }

                const auto& TileSize = Subpass.pShadingRateAttachment->TileSize;
                if (TileSize[0] != 0 || TileSize[1] != 0)
                {
                    if (TileSize[0] < SRProps.MinTileSize[0] || TileSize[0] > SRProps.MaxTileSize[0])
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile width ", TileSize[0],
                                                        " that is not in the allowed range [", SRProps.MinTileSize[0], ", ", SRProps.MaxTileSize[0],
                                                        "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                    }
                    if (TileSize[1] < SRProps.MinTileSize[1] || TileSize[1] > SRProps.MaxTileSize[1])
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile height ", TileSize[1],
                                                        " that is not in the allowed range [", SRProps.MinTileSize[1], ", ", SRProps.MaxTileSize[1],
                                                        "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                    }
                    if (TileSize[0] != TileSize[1])
                    {
                        // The tile size is only used for Vulkan shading rate and current hardware only supports aspect ratio of 1.
                        // TODO: use VkPhysicalDeviceFragmentShadingRatePropertiesKHR::maxFragmentShadingRateAttachmentTexelSizeAspectRatio
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile width ", TileSize[0], " that is not equal to the tile height ", TileSize[1], ".");
                    }
                    if (!IsPowerOfTwo(TileSize[0]) || !IsPowerOfTwo(TileSize[1]))
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile sizes ", TileSize[0], 'x', TileSize[1],
                                                        " that are not a powers of two.");
                    }
                }
            }
        }
    }

    if (pShadingRateAttachment != nullptr && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS) != SHADING_RATE_CAP_FLAG_NONE)
    {
        for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
        {
            const SubpassDesc& Subpass = Desc.pSubpasses[subpass];

            if (Subpass.pShadingRateAttachment == nullptr)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("render pass uses a shading rate attachment, but subpass ", subpass,
                                                " uses no shading rate attachment. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS "
                                                "capability requires that all subpasses of a render pass use the same shading rate attachment.");
            }

            if (*Subpass.pShadingRateAttachment != *pShadingRateAttachment)
            {
                VERIFY_EXPR(subpass > 0);
                LOG_RENDER_PASS_ERROR_AND_THROW("shading rate attachment in subpass ", subpass,
                                                " does not match the shading rate attachment used by previous subpasses. "
                                                "A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability "
                                                "requires that all subpasses of a render pass use the same shading rate attachment.");
            }
        }
    }

    for (Uint32 i = 0; i < Desc.DependencyCount; ++i)
    {
        const SubpassDependencyDesc& Dependency = Desc.pDependencies[i];

        if (Dependency.SrcStageMask == PIPELINE_STAGE_FLAG_UNDEFINED)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the source stage mask of subpass dependency ", i, " is undefined.");
        }
        if (Dependency.DstStageMask == PIPELINE_STAGE_FLAG_UNDEFINED)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the destination stage mask of subpass dependency ", i, " is undefined.");
        }
    }
}